

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O3

string * iutest::detail::MakePrefixedIndexTypedTestName<exception_value>
                   (string *__return_storage_ptr__,char *prefix,char *basename,size_t index)

{
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,prefix,(allocator<char> *)&local_38);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  MakeIndexTypedTestName<exception_value>(&local_38,basename,index);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string MakePrefixedIndexTypedTestName(const char* prefix, const char* basename, size_t index)
{
#if IUTEST_HAS_RTTI
    ::std::string name = prefix;
    if( !name.empty() )
    {
        name += "/";
    }
    name += MakeIndexTypedTestName<T>(basename, index);
    return name;
#else
    return MakePrefixedIndexTestName(prefix, basename, index);
#endif
}